

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cMultiBindTests.cpp
# Opt level: O0

IterateResult __thiscall
gl4cts::MultiBind::ErrorsBindVertexBuffersTest::iterate(ErrorsBindVertexBuffersTest *this)

{
  char cVar1;
  int iVar2;
  deUint32 dVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  TestContext *pTVar5;
  TestLog *pTVar6;
  MessageBuilder *pMVar7;
  TestError *pTVar8;
  Enum<int,_2UL> EVar9;
  Buffer *local_b40;
  Buffer *local_8b0;
  exception *anon_var_0;
  Enum<int,_2UL> local_888;
  GetNameFunc local_878;
  int local_870;
  Enum<int,_2UL> local_868;
  int local_854;
  MessageBuilder local_850;
  int local_6cc;
  GetNameFunc p_Stack_6c8;
  GLenum generated_error_3;
  int local_6c0;
  Enum<int,_2UL> local_6b8;
  GetNameFunc local_6a8;
  int local_6a0;
  Enum<int,_2UL> local_698;
  int local_684;
  MessageBuilder local_680;
  int local_4fc;
  GLenum GStack_4f8;
  GLenum generated_error_2;
  GLsizei t_strides [4];
  GLintptr t_offsets [4];
  Enum<int,_2UL> local_4b8;
  GetNameFunc local_4a8;
  int local_4a0;
  Enum<int,_2UL> local_498;
  int local_484;
  MessageBuilder local_480;
  int local_2fc;
  GLintptr GStack_2f8;
  GLenum generated_error_1;
  GLuint t_buffer_ids [4];
  Enum<int,_2UL> local_2d8;
  GetNameFunc local_2c8;
  int local_2c0;
  Enum<int,_2UL> local_2b8;
  int local_2a4;
  MessageBuilder local_2a0;
  int local_120;
  int local_11c;
  GLenum generated_error;
  GLuint t_first;
  GLsizei t_count;
  GLuint vao;
  size_t j;
  GLsizei strides [4];
  GLintptr offsets [4];
  GLuint buffer_ids [4];
  undefined1 local_b8 [8];
  Buffer buffer [4];
  long local_50;
  size_t validated_index;
  GLintptr GStack_40;
  GLint max_buffers;
  GLintptr offset;
  undefined4 local_30;
  GLuint invalid_id;
  GLuint first;
  GLsizei count;
  GLintptr buffer_size;
  Functions *gl;
  ErrorsBindVertexBuffersTest *this_local;
  
  gl = (Functions *)this;
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  buffer_size = CONCAT44(extraout_var,iVar2);
  _first = 0x10;
  invalid_id = 4;
  local_30 = 0;
  offset._4_4_ = 1;
  GStack_40 = 4;
  validated_index._4_4_ = 0;
  local_50 = 3;
  (**(code **)(buffer_size + 0x868))(0x82da,(long)&validated_index + 4);
  dVar3 = (**(code **)(buffer_size + 0x800))();
  glu::checkError(dVar3,"GetIntegerv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                  ,0x8cc);
  if ((int)validated_index._4_4_ < 4) {
    invalid_id = validated_index._4_4_;
    local_50 = (long)(int)(validated_index._4_4_ - 1);
  }
  local_8b0 = (Buffer *)local_b8;
  do {
    MultiBind::Buffer::Buffer(local_8b0);
    local_8b0 = local_8b0 + 1;
  } while (local_8b0 != (Buffer *)&buffer[3].m_target);
  for (_t_count = 0; _t_count < 4; _t_count = _t_count + 1) {
    MultiBind::Buffer::InitData
              ((Buffer *)&buffer[_t_count - 1].m_target,(this->super_TestCase).m_context,0x8892,
               0x88ea,_first,(GLvoid *)0x0);
    buffer_ids[_t_count - 2] = buffer[_t_count - 1].m_target;
    offsets[_t_count - 1] = GStack_40;
    strides[_t_count - 2] = 4;
  }
  t_first = 0;
  (**(code **)(buffer_size + 0x708))(1,&t_first);
  dVar3 = (**(code **)(buffer_size + 0x800))();
  glu::checkError(dVar3,"GenVertexArrays",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                  ,0x8ea);
  (**(code **)(buffer_size + 0xd8))(t_first);
  dVar3 = (**(code **)(buffer_size + 0x800))();
  glu::checkError(dVar3,"BindVertexArrays",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                  ,0x8ee);
  generated_error = 4;
  local_11c = 0;
  if ((int)validated_index._4_4_ < 4) {
    generated_error = validated_index._4_4_ + 1;
  }
  else {
    local_11c = validated_index._4_4_ - 3;
  }
  (**(code **)(buffer_size + 0xe8))(local_11c,generated_error,offsets + 3,strides + 2,&j);
  local_120 = (**(code **)(buffer_size + 0x800))();
  if (local_120 != 0x502) {
    pTVar5 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar6 = tcu::TestContext::getLog(pTVar5);
    tcu::TestLog::operator<<(&local_2a0,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar7 = tcu::MessageBuilder::operator<<(&local_2a0,(char (*) [7])0x2a28b75);
    pMVar7 = tcu::MessageBuilder::operator<<
                       (pMVar7,(char (*) [128])
                               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                       );
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [9])", line: ");
    local_2a4 = 0x902;
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_2a4);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [20])". Got wrong error: ");
    EVar9 = glu::getErrorStr(local_120);
    local_2c8 = EVar9.m_getName;
    local_2c0 = EVar9.m_value;
    local_2b8.m_getName = local_2c8;
    local_2b8.m_value = local_2c0;
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_2b8);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [13])0x2a14159);
    EVar9 = glu::getErrorStr(0x502);
    t_buffer_ids._8_8_ = EVar9.m_getName;
    local_2d8.m_value = EVar9.m_value;
    local_2d8.m_getName = (GetNameFunc)t_buffer_ids._8_8_;
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_2d8);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [12])", message: ");
    pMVar7 = tcu::MessageBuilder::operator<<
                       (pMVar7,(char (*) [49])"BindVertexBuffers with invalid <first> + <count>");
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_2a0);
    pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar8,"Invalid error generated",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
               ,0x902);
    __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  GStack_2f8 = offsets[3];
  local_120 = 0x502;
  while( true ) {
    cVar1 = (**(code **)(buffer_size + 0xc68))(offset._4_4_);
    if (cVar1 != '\x01') break;
    offset._4_4_ = offset._4_4_ + 1;
  }
  *(int *)((long)&stack0xfffffffffffffd08 + local_50 * 4) = offset._4_4_;
  (**(code **)(buffer_size + 0xe8))(local_30,invalid_id,&stack0xfffffffffffffd08,strides + 2,&j);
  local_2fc = (**(code **)(buffer_size + 0x800))();
  if (local_2fc != 0x502) {
    pTVar5 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar6 = tcu::TestContext::getLog(pTVar5);
    tcu::TestLog::operator<<(&local_480,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar7 = tcu::MessageBuilder::operator<<(&local_480,(char (*) [7])0x2a28b75);
    pMVar7 = tcu::MessageBuilder::operator<<
                       (pMVar7,(char (*) [128])
                               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                       );
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [9])", line: ");
    local_484 = 0x91d;
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_484);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [20])". Got wrong error: ");
    EVar9 = glu::getErrorStr(local_2fc);
    local_4a8 = EVar9.m_getName;
    local_4a0 = EVar9.m_value;
    local_498.m_getName = local_4a8;
    local_498.m_value = local_4a0;
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_498);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [13])0x2a14159);
    EVar9 = glu::getErrorStr(0x502);
    local_4b8.m_getName = EVar9.m_getName;
    local_4b8.m_value = EVar9.m_value;
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_4b8);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [12])", message: ");
    pMVar7 = tcu::MessageBuilder::operator<<
                       (pMVar7,(char (*) [41])"BindVertexBuffers with invalid buffer id");
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_480);
    pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar8,"Invalid error generated",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
               ,0x91d);
    __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  t_strides[2] = strides[2];
  t_strides[3] = strides[3];
  GStack_4f8 = (GLenum)j;
  generated_error_2 = j._4_4_;
  t_strides[0] = strides[0];
  t_strides[1] = strides[1];
  t_offsets[local_50 + -1] = -1;
  (&GStack_4f8)[local_50] = 0xffffffff;
  (**(code **)(buffer_size + 0xe8))(local_30,invalid_id,offsets + 3,t_strides + 2,&j);
  local_4fc = (**(code **)(buffer_size + 0x800))();
  if (local_4fc != 0x501) {
    pTVar5 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar6 = tcu::TestContext::getLog(pTVar5);
    tcu::TestLog::operator<<(&local_680,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar7 = tcu::MessageBuilder::operator<<(&local_680,(char (*) [7])0x2a28b75);
    pMVar7 = tcu::MessageBuilder::operator<<
                       (pMVar7,(char (*) [128])
                               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                       );
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [9])", line: ");
    local_684 = 0x92e;
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_684);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [20])". Got wrong error: ");
    EVar9 = glu::getErrorStr(local_4fc);
    local_6a8 = EVar9.m_getName;
    local_6a0 = EVar9.m_value;
    local_698.m_getName = local_6a8;
    local_698.m_value = local_6a0;
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_698);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [13])0x2a14159);
    EVar9 = glu::getErrorStr(0x501);
    p_Stack_6c8 = EVar9.m_getName;
    local_6c0 = EVar9.m_value;
    local_6b8.m_getName = p_Stack_6c8;
    local_6b8.m_value = local_6c0;
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_6b8);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [12])", message: ");
    pMVar7 = tcu::MessageBuilder::operator<<
                       (pMVar7,(char (*) [39])"BindVertexBuffers with negative offset");
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_680);
    pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar8,"Invalid error generated",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
               ,0x92e);
    __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (**(code **)(buffer_size + 0xe8))(local_30,invalid_id,offsets + 3,strides + 2,&GStack_4f8);
  local_6cc = (**(code **)(buffer_size + 0x800))();
  if (local_6cc != 0x501) {
    pTVar5 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar6 = tcu::TestContext::getLog(pTVar5);
    tcu::TestLog::operator<<(&local_850,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar7 = tcu::MessageBuilder::operator<<(&local_850,(char (*) [7])0x2a28b75);
    pMVar7 = tcu::MessageBuilder::operator<<
                       (pMVar7,(char (*) [128])
                               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                       );
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [9])", line: ");
    local_854 = 0x931;
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_854);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [20])". Got wrong error: ");
    EVar9 = glu::getErrorStr(local_6cc);
    local_878 = EVar9.m_getName;
    local_870 = EVar9.m_value;
    local_868.m_getName = local_878;
    local_868.m_value = local_870;
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_868);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [13])0x2a14159);
    EVar9 = glu::getErrorStr(0x501);
    local_888.m_getName = EVar9.m_getName;
    local_888.m_value = EVar9.m_value;
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_888);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [12])", message: ");
    pMVar7 = tcu::MessageBuilder::operator<<
                       (pMVar7,(char (*) [39])"BindVertexBuffers with negative stride");
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_850);
    pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar8,"Invalid error generated",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
               ,0x931);
    __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (**(code **)(buffer_size + 0x490))(1,&t_first);
  dVar3 = (**(code **)(buffer_size + 0x800))();
  glu::checkError(dVar3,"DeleteVertexArrays",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                  ,0x93b);
  pTVar5 = deqp::Context::getTestContext((this->super_TestCase).m_context);
  tcu::TestContext::setTestResult(pTVar5,QP_TEST_RESULT_PASS,"Pass");
  this_local._4_4_ = STOP;
  local_b40 = (Buffer *)&buffer[3].m_target;
  do {
    local_b40 = local_b40 + -1;
    MultiBind::Buffer::~Buffer(local_b40);
  } while (local_b40 != (Buffer *)local_b8);
  return this_local._4_4_;
}

Assistant:

tcu::TestNode::IterateResult ErrorsBindVertexBuffersTest::iterate()
{
	const Functions& gl = m_context.getRenderContext().getFunctions();

#if DEBUG_ENBALE_MESSAGE_CALLBACK
	gl.debugMessageCallback(debug_proc, &m_context);
	GLU_EXPECT_NO_ERROR(gl.getError(), "DebugMessageCallback");
#endif /* DEBUG_ENBALE_MESSAGE_CALLBACK */

	static const GLsizei n_buffers = 4;
	static const GLsizei stride	= 4;

	GLintptr buffer_size	 = 16;
	GLsizei  count			 = n_buffers;
	GLuint   first			 = 0;
	GLuint   invalid_id		 = 1; /* Start with 1, as 0 is not valid name */
	GLintptr offset			 = 4; /* ATOMIC and XFB require alignment of 4 */
	GLint	max_buffers	 = 0;
	size_t   validated_index = n_buffers - 1;

	/* Get max */
	gl.getIntegerv(GL_MAX_VERTEX_ATTRIB_BINDINGS, &max_buffers);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetIntegerv");

	/* Select count so <first + count> does not exceed max.
	 * Validated index shall be in the specified range.
	 */
	if (n_buffers > max_buffers)
	{
		count			= max_buffers;
		validated_index = max_buffers - 1;
	}

	/* Storage */
	Buffer   buffer[n_buffers];
	GLuint   buffer_ids[n_buffers];
	GLintptr offsets[n_buffers];
	GLsizei  strides[n_buffers];

	/* Prepare buffers */
	for (size_t j = 0; j < n_buffers; ++j)
	{
		buffer[j].InitData(m_context, GL_ARRAY_BUFFER, GL_DYNAMIC_COPY, buffer_size, 0 /* data */);

		buffer_ids[j] = buffer[j].m_id;
		offsets[j]	= offset;
		strides[j]	= stride;
	}

	/* Prepare VAO */
	GLuint vao = 0;
	gl.genVertexArrays(1, &vao);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GenVertexArrays");
	try
	{
		gl.bindVertexArray(vao);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindVertexArrays");

		/* - INVALID_OPERATION when <first> + <count> exceeds limits; */
		{
			GLsizei t_count = n_buffers;
			GLuint  t_first = 0;

			/* Select first so <first + count> exceeds max, avoid negative first */
			if (n_buffers <= max_buffers)
			{
				t_first = max_buffers - n_buffers + 1;
			}
			else
			{
				t_count = max_buffers + 1;
				/* first = 0; */
			}

			/* Test */
			gl.bindVertexBuffers(t_first, t_count, buffer_ids, offsets, strides);
			CHECK_ERROR(GL_INVALID_OPERATION, "BindVertexBuffers with invalid <first> + <count>");
		}

		/* - INVALID_OPERATION if any value in <buffers> is not zero or the name of
		 * existing buffer;
		 */
		{
			GLuint t_buffer_ids[n_buffers];

			memcpy(t_buffer_ids, buffer_ids, sizeof(buffer_ids));

			/* Find invalid id */
			while (1)
			{
				if (GL_TRUE != gl.isBuffer(invalid_id))
				{
					break;
				}

				invalid_id += 1;
			}

			/* Invalidate the entry */
			t_buffer_ids[validated_index] = invalid_id;

			/* Test */
			gl.bindVertexBuffers(first, count, t_buffer_ids, offsets, strides);
			CHECK_ERROR(GL_INVALID_OPERATION, "BindVertexBuffers with invalid buffer id");
		}

		/* - INVALID_VALUE if any value in <offsets> or <strides> is less than zero. */
		{
			GLintptr t_offsets[n_buffers];
			GLsizei  t_strides[n_buffers];

			memcpy(t_offsets, offsets, sizeof(offsets));
			memcpy(t_strides, strides, sizeof(strides));

			/* Invalidate the entry */
			t_offsets[validated_index] = -1;
			t_strides[validated_index] = -1;

			/* Test */
			gl.bindVertexBuffers(first, count, buffer_ids, t_offsets, strides);
			CHECK_ERROR(GL_INVALID_VALUE, "BindVertexBuffers with negative offset");

			gl.bindVertexBuffers(first, count, buffer_ids, offsets, t_strides);
			CHECK_ERROR(GL_INVALID_VALUE, "BindVertexBuffers with negative stride");
		}
	}
	catch (const std::exception&)
	{
		gl.deleteVertexArrays(1, &vao);
		TCU_FAIL("Unexpected error generated");
	}

	gl.deleteVertexArrays(1, &vao);
	GLU_EXPECT_NO_ERROR(gl.getError(), "DeleteVertexArrays");

	/* Set result */
	m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");

	/* Done */
	return tcu::TestNode::STOP;
}